

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

ON_SubDVertex * __thiscall
ON_SubDHeap::AllocateVertexAndSetId(ON_SubDHeap *this,uint candidate_vertex_id)

{
  ON_SubDVertex *pOVar1;
  ON_SubDComponentBase *unused_list;
  ON_SubDVertex *local_18;
  
  local_18 = this->m_unused_vertex;
  pOVar1 = (ON_SubDVertex *)
           Internal_AllocateComponentAndSetId
                     (&this->m_fspv,(ON_SubDComponentBase **)&local_18,&this->m_max_vertex_id,
                      candidate_vertex_id);
  this->m_unused_vertex = local_18;
  return pOVar1;
}

Assistant:

class ON_SubDVertex* ON_SubDHeap::AllocateVertexAndSetId(unsigned int candidate_vertex_id)
{
  ON_SubDComponentBase* unused_list = m_unused_vertex;
  ON_SubDComponentBase* c = ON_SubDHeap::Internal_AllocateComponentAndSetId(
    m_fspv,
    unused_list,
    m_max_vertex_id,
    candidate_vertex_id
  );
  m_unused_vertex = static_cast<ON_SubDVertex*>(unused_list);
  return static_cast<ON_SubDVertex*>(c);
}